

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  uint uVar1;
  aiNodeAnim *pNodeAnim;
  aiMeshMorphAnim *pMeshMorphAnim;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  Validate(this,&pAnimation->mName);
  uVar3 = pAnimation->mNumChannels;
  if (uVar3 == 0) {
    if (pAnimation->mNumMorphMeshChannels == 0) {
      ReportError(this,
                  "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
                 );
    }
  }
  else if (pAnimation->mChannels == (aiNodeAnim **)0x0) {
    pcVar2 = "aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)";
    uVar1 = uVar3;
    goto LAB_002fe59e;
  }
  if ((pAnimation->mMorphMeshChannels != (aiMeshMorphAnim **)0x0) ||
     (uVar1 = pAnimation->mNumMorphMeshChannels, uVar1 == 0)) {
    if (uVar3 == 0) {
LAB_002fe520:
      if (pAnimation->mNumMorphMeshChannels == 0) {
        return;
      }
      pMeshMorphAnim = *pAnimation->mMorphMeshChannels;
      if (pMeshMorphAnim == (aiMeshMorphAnim *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar4 = 1;
        do {
          Validate(this,pAnimation,pMeshMorphAnim);
          if (pAnimation->mNumMorphMeshChannels <= uVar4) {
            return;
          }
          pMeshMorphAnim = pAnimation->mMorphMeshChannels[uVar4];
          uVar4 = uVar4 + 1;
        } while (pMeshMorphAnim != (aiMeshMorphAnim *)0x0);
        uVar3 = (int)uVar4 - 1;
      }
      pcVar2 = 
      "aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
    }
    else {
      pNodeAnim = *pAnimation->mChannels;
      if (pNodeAnim == (aiNodeAnim *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar4 = 1;
        do {
          Validate(this,pAnimation,pNodeAnim);
          if (pAnimation->mNumChannels <= uVar4) goto LAB_002fe520;
          pNodeAnim = pAnimation->mChannels[uVar4];
          uVar4 = uVar4 + 1;
        } while (pNodeAnim != (aiNodeAnim *)0x0);
        uVar3 = (int)uVar4 - 1;
      }
      pcVar2 = "aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)";
    }
    ReportError(this,pcVar2,(ulong)uVar3);
  }
  pcVar2 = "aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
LAB_002fe59e:
  ReportError(this,pcVar2,(ulong)uVar1);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all animations
    if (pAnimation->mNumChannels || pAnimation->mNumMorphMeshChannels)
    {
        if (!pAnimation->mChannels && pAnimation->mNumChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        if (!pAnimation->mMorphMeshChannels && pAnimation->mNumMorphMeshChannels) {
            ReportError("aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                pAnimation->mNumMorphMeshChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
        for (unsigned int i = 0; i < pAnimation->mNumMorphMeshChannels;++i)
        {
            if (!pAnimation->mMorphMeshChannels[i])
            {
                ReportError("aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                    i, pAnimation->mNumMorphMeshChannels);
            }
            Validate(pAnimation, pAnimation->mMorphMeshChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}